

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O2

bool __thiscall slang::ast::IntegralType::isDeclaredReg(IntegralType *this)

{
  bool bVar1;
  
  while ((this->super_Type).super_Symbol.kind == PackedArrayType) {
    this = (IntegralType *)Type::getCanonicalType(*(Type **)&this[1].super_Type.super_Symbol);
  }
  bVar1 = Type::isScalar(&this->super_Type);
  if (bVar1) {
    bVar1 = this[1].super_Type.super_Symbol.kind == Definition;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool IntegralType::isDeclaredReg() const {
    const Type* type = this;
    while (type->kind == SymbolKind::PackedArrayType)
        type = &type->as<PackedArrayType>().elementType.getCanonicalType();

    if (type->isScalar())
        return type->as<ScalarType>().scalarKind == ScalarType::Reg;

    return false;
}